

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O2

void corrupted_header_correct_superblock_test(void)

{
  fdb_doc *doc_00;
  fdb_status fVar1;
  int iVar2;
  int iVar3;
  anomalous_callbacks *paVar4;
  filemgr_ops *pfVar5;
  size_t __size;
  void *pvVar6;
  char *__format;
  ulong uVar7;
  uint uVar8;
  fdb_file_handle *dbfile;
  fdb_doc *doc;
  fdb_kvs_handle *db;
  filemgr_ops *local_370;
  anomalous_callbacks *local_368;
  fdb_kvs_config local_360;
  timeval __test_begin;
  char valuebuf [256];
  fdb_config local_230;
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  anomaly_test* > errorlog.txt");
  fdb_get_default_config();
  local_230.buffercache_size = 0;
  fdb_get_default_kvs_config();
  paVar4 = get_default_anon_cbs();
  filemgr_ops_anomalous_init(paVar4,(void *)0x0);
  pfVar5 = get_normal_ops_ptr();
  fVar1 = fdb_open(&dbfile,"anomaly_test1",&local_230);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x33b);
    corrupted_header_correct_superblock_test()::__test_pass = '\x01';
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x33b,"void corrupted_header_correct_superblock_test()");
  }
  local_370 = pfVar5;
  local_368 = paVar4;
  fVar1 = fdb_kvs_open(dbfile,&db,(char *)0x0,&local_360);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x33e);
    corrupted_header_correct_superblock_test()::__test_pass = '\x01';
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x33e,"void corrupted_header_correct_superblock_test()");
  }
  uVar8 = 0;
  while (uVar8 != 4) {
    for (uVar7 = 0; (int)uVar7 != 200; uVar7 = (ulong)((int)uVar7 + 1)) {
      sprintf(keybuf,"k%06d",uVar7);
      sprintf(valuebuf,"v%d_%04d",(ulong)uVar8);
      fdb_doc_create(&doc,keybuf,8,(void *)0x0,0,valuebuf,8);
      fVar1 = fdb_set(db,doc);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x346);
        corrupted_header_correct_superblock_test()::__test_pass = '\x01';
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x346,"void corrupted_header_correct_superblock_test()");
      }
      fdb_doc_free(doc);
    }
    fVar1 = fdb_commit(dbfile,'\0');
    uVar8 = uVar8 + 1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x34a);
      corrupted_header_correct_superblock_test()::__test_pass = '\x01';
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x34a,"void corrupted_header_correct_superblock_test()");
    }
  }
  fVar1 = fdb_close(dbfile);
  paVar4 = local_368;
  pfVar5 = local_370;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x34e);
    corrupted_header_correct_superblock_test()::__test_pass = '\x01';
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x34e,"void corrupted_header_correct_superblock_test()");
  }
  iVar2 = (*local_368->open_cb)((void *)0x0,local_370,"anomaly_test1",2,0x1a4);
  iVar3 = (*paVar4->open_cb)((void *)0x0,pfVar5,"anomaly_test2",0x42,0x1a4);
  __size = (*paVar4->file_size_cb)((void *)0x0,pfVar5,"anomaly_test1");
  pvVar6 = malloc(__size);
  (*paVar4->pread_cb)((void *)0x0,pfVar5,iVar2,pvVar6,__size,0);
  (*paVar4->pwrite_cb)((void *)0x0,pfVar5,iVar3,pvVar6,__size - 0x1000,0);
  (*paVar4->close_cb)((void *)0x0,pfVar5,iVar2);
  (*paVar4->close_cb)((void *)0x0,pfVar5,iVar3);
  free(pvVar6);
  fVar1 = fdb_open(&dbfile,"anomaly_test2",&local_230);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_open(dbfile,&db,(char *)0x0,&local_360);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x361);
      corrupted_header_correct_superblock_test()::__test_pass = '\x01';
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x361,"void corrupted_header_correct_superblock_test()");
    }
    uVar8 = 0;
    while( true ) {
      if (uVar8 == 200) {
        fVar1 = fdb_close(dbfile);
        if (fVar1 == FDB_RESULT_SUCCESS) {
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (corrupted_header_correct_superblock_test()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"corrupted DB header from correct superblock test");
          return;
        }
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x370);
        corrupted_header_correct_superblock_test()::__test_pass = '\x01';
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x370,"void corrupted_header_correct_superblock_test()");
      }
      sprintf(keybuf,"k%06d",(ulong)uVar8);
      sprintf(valuebuf,"v%d_%04d",2);
      fdb_doc_create(&doc,keybuf,8,(void *)0x0,0,(void *)0x0,0);
      fVar1 = fdb_get(db,doc);
      doc_00 = doc;
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      pvVar6 = doc->body;
      iVar2 = bcmp(pvVar6,valuebuf,doc->bodylen);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",valuebuf,pvVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x36b);
        corrupted_header_correct_superblock_test()::__test_pass = '\x01';
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x36b,"void corrupted_header_correct_superblock_test()");
      }
      fdb_doc_free(doc_00);
      uVar8 = uVar8 + 1;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x36a);
    corrupted_header_correct_superblock_test()::__test_pass = '\x01';
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                  ,0x36a,"void corrupted_header_correct_superblock_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
          ,0x35e);
  corrupted_header_correct_superblock_test()::__test_pass = '\x01';
  __assert_fail("s == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x35e,"void corrupted_header_correct_superblock_test()");
}

Assistant:

void corrupted_header_correct_superblock_test()
{
    TEST_INIT();
    int n=200, n_commits=4, i, j, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[256];
    struct filemgr_ops *normal_ops;

    memleak_start();

    // remove previous dummy files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    kvs_config = fdb_get_default_kvs_config();

    struct anomalous_callbacks *cbs = get_default_anon_cbs();
    filemgr_ops_anomalous_init(cbs, NULL);

    normal_ops = get_normal_ops_ptr();

    // create a file
    s = fdb_open(&dbfile, "anomaly_test1", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    for (j=0; j<n_commits; ++j) {
        for (i=0; i<n; ++i) {
            sprintf(keybuf, "k%06d", i);
            sprintf(valuebuf, "v%d_%04d", j, i);
            fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 8);
            s = fdb_set(db, doc);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            fdb_doc_free(doc);
        }
        s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // copy the data in the file except for the last (header) block
    int fd = cbs->open_cb(NULL, normal_ops, "anomaly_test1", O_RDWR, 0644);
    int fd_dst = cbs->open_cb(NULL, normal_ops,
                              "anomaly_test2", O_CREAT | O_RDWR, 0644);
    uint64_t offset = cbs->file_size_cb(NULL, normal_ops, "anomaly_test1");
    uint8_t *filedata = (uint8_t*)malloc(offset);
    cbs->pread_cb(NULL, normal_ops, fd, (void*)filedata, offset, 0);
    cbs->pwrite_cb(NULL, normal_ops, fd_dst, (void*)filedata, offset - 4096, 0);
    cbs->close_cb(NULL, normal_ops, fd);
    cbs->close_cb(NULL, normal_ops, fd_dst);
    free(filedata);

    // open the corrupted file
    s = fdb_open(&dbfile, "anomaly_test2", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // data at the 3rd commit should be read
    j = 2;
    for (i=0; i<n; ++i) {
        sprintf(keybuf, "k%06d", i);
        sprintf(valuebuf, "v%d_%04d", j, i);
        fdb_doc_create(&doc, keybuf, 8, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(doc->body, valuebuf, doc->bodylen);
        fdb_doc_free(doc);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_shutdown();
    memleak_end();

    TEST_RESULT("corrupted DB header from correct superblock test");
}